

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_client_core_ll.c
# Opt level: O3

void IoTHubClientCore_LL_Destroy(IOTHUB_CLIENT_CORE_LL_HANDLE iotHubClientHandle)

{
  DLIST_ENTRY *pDVar1;
  IOTHUB_CLIENT_CORE_LL_HANDLE pIVar2;
  PDLIST_ENTRY pDVar3;
  
  if (iotHubClientHandle != (IOTHUB_CLIENT_CORE_LL_HANDLE)0x0) {
    (*iotHubClientHandle->IoTHubTransport_Unregister)(iotHubClientHandle->deviceHandle);
    if (iotHubClientHandle->isSharedTransport == false) {
      (*iotHubClientHandle->IoTHubTransport_Destroy)(iotHubClientHandle->transportHandle);
    }
    pIVar2 = (IOTHUB_CLIENT_CORE_LL_HANDLE)DList_RemoveHeadList(&iotHubClientHandle->waitingToSend);
    while (pIVar2 != iotHubClientHandle) {
      if (pIVar2[-1].event_callbacks != (SINGLYLINKEDLIST_HANDLE)0x0) {
        (*(code *)pIVar2[-1].event_callbacks)(1,pIVar2[-1].model_id);
      }
      IoTHubMessage_Destroy((IOTHUB_MESSAGE_HANDLE)pIVar2[-1].diagnostic_setting);
      free(&pIVar2[-1].diagnostic_setting);
      pIVar2 = (IOTHUB_CLIENT_CORE_LL_HANDLE)
               DList_RemoveHeadList(&iotHubClientHandle->waitingToSend);
    }
    pDVar1 = &iotHubClientHandle->iot_msg_queue;
    pDVar3 = DList_RemoveHeadList(pDVar1);
    while (pDVar3 != pDVar1) {
      if (pDVar3[-2].Blink != (DLIST_ENTRY_TAG *)0x0) {
        (*(code *)pDVar3[-2].Blink)(0,pDVar3[-1].Blink);
      }
      CONSTBUFFER_DecRef((CONSTBUFFER_HANDLE)pDVar3[-1].Flink);
      free(&pDVar3[-3].Blink);
      pDVar3 = DList_RemoveHeadList(pDVar1);
    }
    pDVar1 = &iotHubClientHandle->iot_ack_queue;
    pDVar3 = DList_RemoveHeadList(pDVar1);
    while (pDVar3 != pDVar1) {
      if (pDVar3[-2].Blink != (DLIST_ENTRY_TAG *)0x0) {
        (*(code *)pDVar3[-2].Blink)(0,pDVar3[-1].Blink);
      }
      CONSTBUFFER_DecRef((CONSTBUFFER_HANDLE)pDVar3[-1].Flink);
      free(&pDVar3[-3].Blink);
      pDVar3 = DList_RemoveHeadList(pDVar1);
    }
    delete_event_callback_list(iotHubClientHandle);
    IoTHubClient_Auth_Destroy(iotHubClientHandle->authorization_module);
    tickcounter_destroy(iotHubClientHandle->tickCounter);
    IoTHubClient_LL_UploadToBlob_Destroy(iotHubClientHandle->uploadToBlobHandle);
    STRING_delete(iotHubClientHandle->product_info);
    STRING_delete(iotHubClientHandle->model_id);
    free(iotHubClientHandle);
    return;
  }
  return;
}

Assistant:

void IoTHubClientCore_LL_Destroy(IOTHUB_CLIENT_CORE_LL_HANDLE iotHubClientHandle)
{
    if (iotHubClientHandle != NULL)
    {
        PDLIST_ENTRY unsend;
        IOTHUB_CLIENT_CORE_LL_HANDLE_DATA* handleData = (IOTHUB_CLIENT_CORE_LL_HANDLE_DATA*)iotHubClientHandle;
        handleData->IoTHubTransport_Unregister(handleData->deviceHandle);
        if (handleData->isSharedTransport == false)
        {
            handleData->IoTHubTransport_Destroy(handleData->transportHandle);
        }
        /*if any, remove the items currently not send*/
        while ((unsend = DList_RemoveHeadList(&(handleData->waitingToSend))) != &(handleData->waitingToSend))
        {
            IOTHUB_MESSAGE_LIST* temp = containingRecord(unsend, IOTHUB_MESSAGE_LIST, entry);
            if (temp->callback != NULL)
            {
                temp->callback(IOTHUB_CLIENT_CONFIRMATION_BECAUSE_DESTROY, temp->context);
            }
            IoTHubMessage_Destroy(temp->messageHandle);
            free(temp);
        }

        while ((unsend = DList_RemoveHeadList(&(handleData->iot_msg_queue))) != &(handleData->iot_msg_queue))
        {
            IOTHUB_DEVICE_TWIN* temp = containingRecord(unsend, IOTHUB_DEVICE_TWIN, entry);

            // The Twin reported properties status codes are based on HTTP codes and provided by the service.
            // Following design already implemented in the transport layer, the status code shall be artificially 
            // returned as zero to indicate the report was not sent due to the client being destroyed.
            if (temp->reported_state_callback != NULL)
            {
                temp->reported_state_callback(ERROR_CODE_BECAUSE_DESTROY, temp->context);
            }  

            device_twin_data_destroy(temp);
        }
        while ((unsend = DList_RemoveHeadList(&(handleData->iot_ack_queue))) != &(handleData->iot_ack_queue))
        {
            IOTHUB_DEVICE_TWIN* temp = containingRecord(unsend, IOTHUB_DEVICE_TWIN, entry);

            // The Twin reported properties status codes are based on HTTP codes and provided by the service.
            // Following design already implemented in the transport layer, the status code shall be artificially 
            // returned as zero to indicate the report was not sent due to the client being destroyed.
            if (temp->reported_state_callback != NULL)
            {
                temp->reported_state_callback(ERROR_CODE_BECAUSE_DESTROY, temp->context);
            }

            device_twin_data_destroy(temp);
        }

        delete_event_callback_list(handleData);

        IoTHubClient_Auth_Destroy(handleData->authorization_module);
        tickcounter_destroy(handleData->tickCounter);
#ifndef DONT_USE_UPLOADTOBLOB
        IoTHubClient_LL_UploadToBlob_Destroy(handleData->uploadToBlobHandle);
#endif
#ifdef USE_EDGE_MODULES
        IoTHubClient_EdgeHandle_Destroy(handleData->methodHandle);
#endif
        STRING_delete(handleData->product_info);
        STRING_delete(handleData->model_id);
        free(handleData);
    }
}